

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O1

Vec4 __thiscall
deqp::gles2::Functional::anon_unknown_1::genRandomVector(anon_unknown_1 *this,Random *rnd)

{
  float fVar1;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Vec4 VVar2;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  *(float *)this = fVar1 + fVar1 + -1.0;
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  *(float *)(this + 4) = fVar1 + fVar1 + -1.0;
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  *(float *)(this + 8) = fVar1 + fVar1 + -1.0;
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  VVar2.m_data[0] = fVar1 * 0.8 + 0.2;
  *(float *)(this + 0xc) = VVar2.m_data[0];
  VVar2.m_data[1] = (float)extraout_XMM0_Db;
  VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

static tcu::Vec4 genRandomVector (de::Random& rnd)
{
	tcu::Vec4 retVal;

	retVal.x() = rnd.getFloat(-1.0f, 1.0f);
	retVal.y() = rnd.getFloat(-1.0f, 1.0f);
	retVal.z() = rnd.getFloat(-1.0f, 1.0f);
	retVal.w() = rnd.getFloat( 0.2f, 1.0f);

	return retVal;
}